

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateCopyLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  __type _Var2;
  string *psVar3;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string err;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    Result::~Result(__return_storage_ptr__);
    err.field_2._M_local_buf[0xf] = '\0';
    validateOutputCount(__return_storage_ptr__,layer,1,1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      err.field_2._M_local_buf[0xf] = '\x01';
    }
    if ((err.field_2._M_local_buf[0xf] & 1U) == 0) {
      Result::~Result(__return_storage_ptr__);
    }
    if (bVar1) {
      psVar3 = Specification::NeuralNetworkLayer::input_abi_cxx11_(layer,0);
      __rhs = Specification::NeuralNetworkLayer::output_abi_cxx11_(layer,0);
      _Var2 = std::operator==(psVar3,__rhs);
      if (_Var2) {
        psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
        std::operator+(&local_80,"Copy layer \'",psVar3);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60
                       ,&local_80,"\' has identical input and output names.");
        std::__cxx11::string::~string((string *)&local_80);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_60);
        std::__cxx11::string::~string((string *)local_60);
      }
      else {
        Result::Result(__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateCopyLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (layer.input(0) == layer.output(0)) {
        const std::string err = "Copy layer '" + layer.name() + "' has identical input and output names.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    return Result();
}